

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O0

void __thiscall
RPCResult::RPCResult
          (RPCResult *this,Type type,string *m_key_name,bool optional,string *description,
          vector<RPCResult,_std::allocator<RPCResult>_> *inner,bool skip_type_check)

{
  long lVar1;
  byte in_CL;
  undefined4 in_ESI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  RPCResult *in_R9;
  long in_FS_OFFSET;
  byte in_stack_00000008;
  vector<RPCResult,_std::allocator<RPCResult>_> *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined4 *)&(in_RDI->_M_dataplus)._M_p = in_ESI;
  std::__cxx11::string::string(in_RDI,in_stack_ffffffffffffffa0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (in_stack_ffffffffffffff68,(vector<RPCResult,_std::allocator<RPCResult>_> *)0x9ce8c0);
  *(byte *)&in_RDI[2]._M_dataplus._M_p = in_CL & 1;
  *(byte *)((long)&in_RDI[2]._M_dataplus._M_p + 1) = in_stack_00000008 & 1;
  std::__cxx11::string::string(in_RDI,in_stack_ffffffffffffffa0);
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_R9);
  CheckInnerDoc(in_R9);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

RPCResult(
        Type type,
        std::string m_key_name,
        bool optional,
        std::string description,
        std::vector<RPCResult> inner = {},
        bool skip_type_check = false)
        : m_type{std::move(type)},
          m_key_name{std::move(m_key_name)},
          m_inner{std::move(inner)},
          m_optional{optional},
          m_skip_type_check{skip_type_check},
          m_description{std::move(description)},
          m_cond{}
    {
        CheckInnerDoc();
    }